

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::GetPawnMoves<false,true>(Node *this,int from,int depth)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  MoveType type;
  ulong uVar16;
  uint uVar17;
  uint pc;
  uint cap;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  uVar16 = (ulong)(uint)from;
  pcVar2 = (char *)(&_board)[uVar16];
  if (pcVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  if (*pcVar2 != '\x02') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  if ((uint)(byte)pcVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  iVar4 = GetPinDir(this,false,from);
  uVar17 = 0;
  if (depth == 0) {
    uVar5 = GetDiscoverDir(this,false,from);
    uVar17 = uVar5 + 0x10 & 0xffffffdf;
    if (uVar17 != 0) {
      uVar17 = uVar5;
    }
  }
  uVar15 = *(ulong *)(_pawnCaps + uVar16 * 8);
  do {
    if (uVar15 == 0) {
      if ((uint)from >> 4 == 6 || depth == 0) {
        uVar5 = from + 0x10;
        if (iVar4 != 0) {
          iVar6 = Direction(from,uVar5);
          iVar14 = -iVar6;
          if (0 < iVar6) {
            iVar14 = iVar6;
          }
          if (iVar14 != iVar4) {
            return;
          }
        }
        if ((undefined *)(&_board)[uVar5] == _EMPTY) {
          if ((uVar5 & 0xf0) == 0x70) {
            AddMove(this,PawnMove,from,uVar5,0x3cf,0,10);
            if (depth != 0) {
              return;
            }
            type = PawnMove;
            AddMove(this,PawnMove,from,uVar5,500,0,8);
            AddMove(this,PawnMove,from,uVar5,0x140,0,6);
            iVar14 = 4;
            iVar4 = 300;
          }
          else {
            if (depth != 0) {
              __assert_fail("!depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x658,
                            "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                           );
            }
            if ((from + 0x21U == (uint)(byte)PTR_DAT_00158348[1] ||
                from + 0x1fU == (uint)(byte)PTR_DAT_00158348[1]) || uVar17 != 0) {
              AddMove(this,PawnMove,from,uVar5,
                      (*(int *)(_PAWN_SQR + (ulong)uVar5 * 4) - *(int *)(_PAWN_SQR + uVar16 * 4)) +
                      0x19,0,0);
            }
            if ((uint)from >> 4 != 1) {
              return;
            }
            uVar5 = from | 0x20;
            if ((undefined *)(&_board)[uVar5] != _EMPTY) {
              return;
            }
            if (uVar17 == 0 &&
                (from + 0x31U != (uint)(byte)PTR_DAT_00158348[1] &&
                from + 0x2fU != (uint)(byte)PTR_DAT_00158348[1])) {
              return;
            }
            iVar4 = (*(int *)(_PAWN_SQR + (ulong)uVar5 * 4) - *(int *)(_PAWN_SQR + uVar16 * 4)) +
                    0x1e;
            iVar14 = 0;
            type = PawnLung;
          }
          AddMove(this,type,from,uVar5,iVar4,0,iVar14);
        }
      }
      return;
    }
    if ((uVar15 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x629,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                   );
    }
    iVar14 = (int)(uVar15 & 0xff);
    uVar5 = iVar14 - 1;
    iVar6 = Distance(from,uVar5);
    if (iVar6 != 1) {
      __assert_fail("Distance(from, to) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62b,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                   );
    }
    iVar6 = Direction(from,uVar5);
    iVar7 = Direction(from,uVar5);
    iVar8 = Direction(from,uVar5);
    iVar9 = Direction(from,uVar5);
    iVar10 = Direction(from,uVar5);
    iVar11 = Direction(from,uVar5);
    iVar12 = Direction(from,uVar5);
    iVar13 = Direction(from,uVar5);
    if ((((iVar6 != -0x11) && (iVar7 != -0xf)) && (iVar8 != 0xf)) &&
       (((iVar9 != 0x11 && (iVar10 != -0x10)) &&
        ((iVar11 != -1 && ((iVar12 != 1 && (iVar13 != 0x10)))))))) {
      __assert_fail("IS_DIR(Direction(from, to))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62c,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                   );
    }
    if (iVar4 == 0) {
LAB_0012c172:
      bVar1 = *(byte *)(&_board)[uVar5];
      if ((bVar1 == 0) && ((byte *)(&_board)[uVar5] != _EMPTY)) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x631,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                     );
      }
      pc = (uint)bVar1;
      if (pc == 0) {
        if (((this->ep != 0x78) && (uVar5 == this->ep)) &&
           (bVar3 = EpPinned<false>(from,iVar14 + -0x11), !bVar3)) {
          iVar6 = 0;
          iVar14 = 100;
          cap = 0;
          goto LAB_0012c2a9;
        }
      }
      else if ((bVar1 & 1) != 0) {
        iVar14 = ValueOf(pc);
        cap = (uint)bVar1;
        if ((uVar5 & 0xfffffff0) == 0x70) {
          AddMove(this,PawnCap,from,uVar5,iVar14 + 0x3cf,pc,10);
          if (depth != 0) goto LAB_0012c2ae;
          AddMove(this,PawnCap,from,uVar5,iVar14 + 500,cap,8);
          AddMove(this,PawnCap,from,uVar5,iVar14 + 0x140,cap,6);
          iVar14 = iVar14 + 300;
          iVar6 = 4;
        }
        else {
          iVar6 = 0;
        }
LAB_0012c2a9:
        AddMove(this,PawnCap,from,uVar5,iVar14,cap,iVar6);
      }
    }
    else {
      iVar7 = Direction(from,uVar5);
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar6 == iVar4) goto LAB_0012c172;
    }
LAB_0012c2ae:
    uVar15 = uVar15 >> 8;
  } while( true );
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }